

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar9 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_add op;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  int local_aa4;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  int local_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  int local_808;
  undefined8 *local_7f8;
  float *local_7f0;
  undefined1 (*local_7e8) [64];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_7f8 = in_RDX;
  local_7f0 = in_RSI;
  local_7e8 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_808 = 0; local_808 < in_ECX; local_808 = local_808 + 1) {
      auVar9 = vbroadcastss_avx512f(ZEXT416((uint)*local_7f0));
      auVar9 = vaddps_avx512f(*local_7e8,auVar9);
      local_900 = auVar9._0_8_;
      uStack_8f8 = auVar9._8_8_;
      uStack_8f0 = auVar9._16_8_;
      uStack_8e8 = auVar9._24_8_;
      uStack_8e0 = auVar9._32_8_;
      uStack_8d8 = auVar9._40_8_;
      uStack_8d0 = auVar9._48_8_;
      uStack_8c8 = auVar9._56_8_;
      *local_7f8 = local_900;
      local_7f8[1] = uStack_8f8;
      local_7f8[2] = uStack_8f0;
      local_7f8[3] = uStack_8e8;
      local_7f8[4] = uStack_8e0;
      local_7f8[5] = uStack_8d8;
      local_7f8[6] = uStack_8d0;
      local_7f8[7] = uStack_8c8;
      local_7e8 = local_7e8 + 1;
      local_7f0 = local_7f0 + 1;
      local_7f8 = local_7f8 + 8;
    }
  }
  if (in_R8D == 8) {
    for (local_904 = 0; local_904 + 1 < in_ECX; local_904 = local_904 + 2) {
      fVar1 = *local_7f0;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      uStack_110 = auVar5._0_8_;
      uStack_108 = auVar5._8_8_;
      fVar1 = local_7f0[1];
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x30);
      uStack_d0 = auVar6._0_8_;
      uStack_c8 = auVar6._8_8_;
      auVar8._16_8_ = uStack_d0;
      auVar8._0_16_ = auVar5;
      auVar8._24_8_ = uStack_c8;
      auVar9 = vinsertf64x4_avx512f
                         (ZEXT3264(CONCAT824(uStack_108,CONCAT816(uStack_110,auVar4))),auVar8,1);
      auVar9 = vaddps_avx512f(*local_7e8,auVar9);
      local_a40 = auVar9._0_8_;
      uStack_a38 = auVar9._8_8_;
      uStack_a30 = auVar9._16_8_;
      uStack_a28 = auVar9._24_8_;
      uStack_a20 = auVar9._32_8_;
      uStack_a18 = auVar9._40_8_;
      uStack_a10 = auVar9._48_8_;
      uStack_a08 = auVar9._56_8_;
      *local_7f8 = local_a40;
      local_7f8[1] = uStack_a38;
      local_7f8[2] = uStack_a30;
      local_7f8[3] = uStack_a28;
      local_7f8[4] = uStack_a20;
      local_7f8[5] = uStack_a18;
      local_7f8[6] = uStack_a10;
      local_7f8[7] = uStack_a08;
      local_7e8 = local_7e8 + 1;
      local_7f0 = local_7f0 + 2;
      local_7f8 = local_7f8 + 8;
    }
    for (; local_904 < in_ECX; local_904 = local_904 + 1) {
      fVar1 = *local_7f0;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      local_360 = (float)*(undefined8 *)*local_7e8;
      fStack_35c = (float)((ulong)*(undefined8 *)*local_7e8 >> 0x20);
      fStack_358 = (float)*(undefined8 *)(*local_7e8 + 8);
      fStack_354 = (float)((ulong)*(undefined8 *)(*local_7e8 + 8) >> 0x20);
      fStack_350 = (float)*(undefined8 *)(*local_7e8 + 0x10);
      fStack_34c = (float)((ulong)*(undefined8 *)(*local_7e8 + 0x10) >> 0x20);
      fStack_348 = (float)*(undefined8 *)(*local_7e8 + 0x18);
      fStack_344 = (float)((ulong)*(undefined8 *)(*local_7e8 + 0x18) >> 0x20);
      local_380 = auVar5._0_4_;
      fStack_37c = auVar5._4_4_;
      fStack_378 = auVar5._8_4_;
      fStack_374 = auVar5._12_4_;
      fStack_370 = auVar4._0_4_;
      fStack_36c = auVar4._4_4_;
      fStack_368 = auVar4._8_4_;
      fStack_364 = auVar4._12_4_;
      *local_7f8 = CONCAT44(fStack_35c + fStack_37c,local_360 + local_380);
      local_7f8[1] = CONCAT44(fStack_354 + fStack_374,fStack_358 + fStack_378);
      local_7f8[2] = CONCAT44(fStack_34c + fStack_36c,fStack_350 + fStack_370);
      local_7f8[3] = CONCAT44(fStack_344 + fStack_364,fStack_348 + fStack_368);
      local_7e8 = (undefined1 (*) [64])(*local_7e8 + 0x20);
      local_7f0 = local_7f0 + 1;
      local_7f8 = local_7f8 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_aa4 = 0; local_aa4 + 3 < in_ECX; local_aa4 = local_aa4 + 4) {
      fVar1 = *local_7f0;
      fVar2 = local_7f0[1];
      fVar3 = local_7f0[2];
      auVar7._4_4_ = fVar3;
      auVar7._0_4_ = fVar3;
      auVar7._12_4_ = fVar3;
      auVar7._8_4_ = fVar3;
      fVar3 = local_7f0[3];
      auVar7._20_4_ = fVar3;
      auVar7._16_4_ = fVar3;
      auVar7._28_4_ = fVar3;
      auVar7._24_4_ = fVar3;
      auVar9 = vinsertf64x4_avx512f
                         (ZEXT3264(CONCAT824(CONCAT44(fVar2,fVar2),
                                             CONCAT816(CONCAT44(fVar2,fVar2),
                                                       CONCAT88(CONCAT44(fVar1,fVar1),
                                                                CONCAT44(fVar1,fVar1))))),auVar7,1);
      auVar9 = vaddps_avx512f(*local_7e8,auVar9);
      local_c00 = auVar9._0_8_;
      uStack_bf8 = auVar9._8_8_;
      uStack_bf0 = auVar9._16_8_;
      uStack_be8 = auVar9._24_8_;
      uStack_be0 = auVar9._32_8_;
      uStack_bd8 = auVar9._40_8_;
      uStack_bd0 = auVar9._48_8_;
      uStack_bc8 = auVar9._56_8_;
      *local_7f8 = local_c00;
      local_7f8[1] = uStack_bf8;
      local_7f8[2] = uStack_bf0;
      local_7f8[3] = uStack_be8;
      local_7f8[4] = uStack_be0;
      local_7f8[5] = uStack_bd8;
      local_7f8[6] = uStack_bd0;
      local_7f8[7] = uStack_bc8;
      local_7e8 = local_7e8 + 1;
      local_7f0 = local_7f0 + 4;
      local_7f8 = local_7f8 + 8;
    }
    for (; local_aa4 + 1 < in_ECX; local_aa4 = local_aa4 + 2) {
      fVar1 = *local_7f0;
      fVar2 = local_7f0[1];
      local_320 = (float)*(undefined8 *)*local_7e8;
      fStack_31c = (float)((ulong)*(undefined8 *)*local_7e8 >> 0x20);
      fStack_318 = (float)*(undefined8 *)(*local_7e8 + 8);
      fStack_314 = (float)((ulong)*(undefined8 *)(*local_7e8 + 8) >> 0x20);
      fStack_310 = (float)*(undefined8 *)(*local_7e8 + 0x10);
      fStack_30c = (float)((ulong)*(undefined8 *)(*local_7e8 + 0x10) >> 0x20);
      fStack_308 = (float)*(undefined8 *)(*local_7e8 + 0x18);
      fStack_304 = (float)((ulong)*(undefined8 *)(*local_7e8 + 0x18) >> 0x20);
      *local_7f8 = CONCAT44(fStack_31c + fVar1,local_320 + fVar1);
      local_7f8[1] = CONCAT44(fStack_314 + fVar1,fStack_318 + fVar1);
      local_7f8[2] = CONCAT44(fStack_30c + fVar2,fStack_310 + fVar2);
      local_7f8[3] = CONCAT44(fStack_304 + fVar2,fStack_308 + fVar2);
      local_7e8 = (undefined1 (*) [64])(*local_7e8 + 0x20);
      local_7f0 = local_7f0 + 2;
      local_7f8 = local_7f8 + 4;
    }
    for (; local_aa4 < in_ECX; local_aa4 = local_aa4 + 1) {
      fVar1 = *local_7f0;
      local_2e0 = (float)*(undefined8 *)*local_7e8;
      fStack_2dc = (float)((ulong)*(undefined8 *)*local_7e8 >> 0x20);
      fStack_2d8 = (float)*(undefined8 *)(*local_7e8 + 8);
      fStack_2d4 = (float)((ulong)*(undefined8 *)(*local_7e8 + 8) >> 0x20);
      *local_7f8 = CONCAT44(fStack_2dc + fVar1,local_2e0 + fVar1);
      local_7f8[1] = CONCAT44(fStack_2d4 + fVar1,fStack_2d8 + fVar1);
      local_7e8 = (undefined1 (*) [64])(*local_7e8 + 0x10);
      local_7f0 = local_7f0 + 1;
      local_7f8 = local_7f8 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}